

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNlsolver.cpp
# Opt level: O3

double chrono::ChNonlinearSolver::NewtonRaphson
                 (_func_void_ChVectorRef_ChVectorRef_void_ptr *m_func,
                 _func_void_ChVectorRef_ChMatrixRef_void_ptr *m_jacob,ChVectorRef *mx,void *my_data,
                 int maxiters,double tolerance)

{
  Index size_00;
  double *pdVar1;
  ulong uVar2;
  ChVectorRef CVar3;
  ChVectorRef CVar4;
  ChVectorRef CVar5;
  ChMatrixRef CVar6;
  Index size;
  char *__function;
  int iVar7;
  double *pdVar8;
  ulong uVar9;
  ulong uVar10;
  double *pdVar11;
  undefined1 auVar12 [64];
  ChVectorDynamic<> res;
  ChMatrixDynamic<> jac;
  ChVectorDynamic<> delta;
  undefined1 in_stack_fffffffffffffdc8 [16];
  double *__s;
  long lVar13;
  undefined1 in_stack_fffffffffffffde8 [12];
  double *pdVar14;
  int *piVar15;
  Matrix<double,__1,_1,_0,__1,_1> local_1e8;
  double local_1d8;
  double *local_1d0;
  SrcXprType local_1c8;
  double local_1b8;
  double *local_1b0;
  int *local_1a8;
  RealScalar local_1a0;
  Index local_198;
  ChVectorRef local_188;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined1 local_158;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined1 local_138;
  ChMatrixRef local_128;
  double *local_100;
  long local_f8;
  double *local_e8;
  long local_e0;
  ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> local_d0;
  
  __s = (double *)0x0;
  lVar13 = 0;
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  pdVar14 = (double *)0x0;
  piVar15 = (int *)0x0;
  size_00 = *(Index *)&(mx->
                       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                       ).field_0x8;
  local_1d0 = (double *)m_func;
  local_1b8 = tolerance;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&stack0xfffffffffffffdd8,
             size_00);
  if (lVar13 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (lVar13 != 0) {
    memset(__s,0,lVar13 << 3);
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&stack0xfffffffffffffdf8,
             size_00,size_00);
  if (maxiters < 1) {
    local_1d8 = 0.0;
  }
  else {
    iVar7 = 0;
    do {
      local_138 = (mx->
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                  ).field_0x10;
      local_148 = *(undefined8 *)
                   &mx->
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
      ;
      uStack_140 = *(undefined8 *)
                    &(mx->
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     ).field_0x8;
      local_e8 = __s;
      local_e0 = lVar13;
      if (lVar13 < 0 && __s != (double *)0x0) {
LAB_007d1004:
        __function = 
        "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 0]"
        ;
LAB_007d104f:
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,__function);
      }
      CVar3.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
      _16_8_ = __s;
      CVar3.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
      _0_16_ = in_stack_fffffffffffffdc8;
      CVar5.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
      _8_12_ = in_stack_fffffffffffffde8;
      CVar5.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
      _0_8_ = lVar13;
      CVar5.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
      _20_4_ = maxiters;
      (*(code *)local_1d0)(CVar3,CVar5,&local_148);
      if (lVar13 == 0) {
        local_1d8 = 0.0;
      }
      else {
        local_1c8.m_dec =
             (ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)
             &stack0xfffffffffffffdd8;
        if (lVar13 < 1) {
          __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                        "/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,
                        "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_max_op<double>]"
                       );
        }
        local_d0.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
        m_rows = (Index)__s;
        local_1d8 = Eigen::internal::
                    redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                    ::
                    run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                              ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                *)&local_d0,
                               (scalar_max_op<double,_double,_0> *)&stack0xfffffffffffffdd7,
                               (CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                *)&local_1c8);
      }
      if (local_1d8 <= local_1b8) break;
      if (m_jacob == (_func_void_ChVectorRef_ChMatrixRef_void_ptr *)0x0) {
        local_188.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
        ._16_1_ = (mx->
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                  ).field_0x10;
        local_188.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
        ._0_8_ = *(undefined8 *)
                  &mx->
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
        ;
        local_188.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
        ._8_8_ = *(undefined8 *)
                  &(mx->
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   ).field_0x8;
        local_100 = __s;
        local_f8 = lVar13;
        if (lVar13 < 0 && __s != (double *)0x0) goto LAB_007d1004;
        local_128.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_cols.m_value = 0;
        local_128.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_data = pdVar14;
        local_128.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_rows.m_value = (long)piVar15;
        if ((long)piVar15 < 0 && pdVar14 != (double *)0x0) goto LAB_007d103a;
        local_128.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .m_stride.m_outer.m_value = 0;
        JacobianCompute((_func_void_ChVectorRef_ChVectorRef_void_ptr *)local_1d0,&local_188,
                        (ChVectorRef *)&local_100,my_data,&local_128,1e-07);
      }
      else {
        local_158 = (mx->
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                    ).field_0x10;
        local_168 = *(undefined8 *)
                     &mx->
                      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
        ;
        uStack_160 = *(undefined8 *)
                      &(mx->
                       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                       ).field_0x8;
        local_198 = 0;
        local_1a0 = 0.0;
        local_1b0 = pdVar14;
        local_1a8 = piVar15;
        if ((long)piVar15 < 0 && pdVar14 != (double *)0x0) {
LAB_007d103a:
          __function = 
          "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
          ;
          goto LAB_007d104f;
        }
        local_198 = 0;
        CVar4.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
        ._16_8_ = __s;
        CVar4.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
        ._0_16_ = in_stack_fffffffffffffdc8;
        CVar6.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        ._8_12_ = in_stack_fffffffffffffde8;
        CVar6.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_data = (PointerType)lVar13;
        CVar6.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_cols.m_value._4_4_ = maxiters;
        CVar6.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .m_stride.m_outer.m_value = (long)pdVar14;
        CVar6.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .m_stride._8_8_ = piVar15;
        (*m_jacob)(CVar4,CVar6,&local_168);
      }
      Eigen::ColPivHouseholderQR<Eigen::Matrix<double,-1,-1,1,-1,-1>>::
      ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                ((ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&local_d0,
                 (EigenBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&stack0xfffffffffffffdf8);
      Eigen::SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,-1,-1,1,-1,-1>>>::
      _check_solve_assertion<false,Eigen::MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>>>
                ((SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,1,_1,_1>>> *)
                 &local_d0,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&stack0xfffffffffffffdd8);
      local_1c8.m_dec = &local_d0;
      local_1c8.m_rhs = (Matrix<double,__1,_1,_0,__1,_1> *)&stack0xfffffffffffffdd8;
      Eigen::internal::
      Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
      ::run(&local_1e8,&local_1c8,(assign_op<double,_double> *)&stack0xfffffffffffffdd7);
      if (local_d0.m_colNormsDirect.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
          m_storage.m_data != (double *)0x0) {
        free((void *)local_d0.m_colNormsDirect.
                     super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data
                     [-1]);
      }
      if (local_d0.m_colNormsUpdated.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
          m_storage.m_data != (double *)0x0) {
        free((void *)local_d0.m_colNormsUpdated.
                     super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data
                     [-1]);
      }
      if (local_d0.m_temp.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
          m_data != (double *)0x0) {
        free((void *)local_d0.m_temp.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                     m_storage.m_data[-1]);
      }
      if (local_d0.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<long,_1,__1,_1,_1,__1>_>
          .m_storage.m_data != (long *)0x0) {
        free((void *)local_d0.m_colsTranspositions.
                     super_PlainObjectBase<Eigen::Matrix<long,_1,__1,_1,_1,__1>_>.m_storage.m_data
                     [-1]);
      }
      if (local_d0.m_colsPermutation.m_indices.
          super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data != (int *)0x0
         ) {
        free(*(void **)(local_d0.m_colsPermutation.m_indices.
                        super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data
                       + -2));
      }
      if (local_d0.m_hCoeffs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_data != (double *)0x0) {
        free((void *)local_d0.m_hCoeffs.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                     [-1]);
      }
      if (local_d0.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_data != (double *)0x0) {
        free((void *)local_d0.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_data[-1]);
      }
      pdVar1 = *(double **)
                &(mx->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ).field_0x8;
      if (pdVar1 != (double *)
                    local_1e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_rows) {
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, SrcXprType = Eigen::Matrix<double, -1, 1>, Functor = Eigen::internal::sub_assign_op<double, double>]"
                     );
      }
      uVar2 = *(ulong *)&mx->
                         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
      ;
      pdVar8 = pdVar1;
      if (((uVar2 & 7) == 0) &&
         (pdVar8 = (double *)(ulong)(-((uint)(uVar2 >> 3) & 0x1fffffff) & 7),
         (long)pdVar1 <= (long)pdVar8)) {
        pdVar8 = pdVar1;
      }
      uVar10 = (long)pdVar1 - (long)pdVar8;
      uVar9 = uVar10 + 7;
      if (-1 < (long)uVar10) {
        uVar9 = uVar10;
      }
      if (0 < (long)pdVar8) {
        pdVar11 = (double *)0x0;
        do {
          *(double *)(uVar2 + (long)pdVar11 * 8) =
               *(double *)(uVar2 + (long)pdVar11 * 8) -
               local_1e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data[(long)pdVar11];
          pdVar11 = (double *)((long)pdVar11 + 1);
        } while (pdVar8 != pdVar11);
      }
      pdVar11 = (double *)((uVar9 & 0xfffffffffffffff8) + (long)pdVar8);
      if (7 < (long)uVar10) {
        do {
          auVar12 = vsubpd_avx512f(*(undefined1 (*) [64])(uVar2 + (long)pdVar8 * 8),
                                   *(undefined1 (*) [64])
                                    (local_1e8.
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                     m_storage.m_data + (long)pdVar8));
          *(undefined1 (*) [64])(uVar2 + (long)pdVar8 * 8) = auVar12;
          pdVar8 = pdVar8 + 1;
        } while ((long)pdVar8 < (long)pdVar11);
      }
      if ((long)pdVar11 < (long)pdVar1) {
        do {
          *(double *)(uVar2 + (long)pdVar11 * 8) =
               *(double *)(uVar2 + (long)pdVar11 * 8) -
               local_1e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data[(long)pdVar11];
          pdVar11 = (double *)((long)pdVar11 + 1);
        } while (pdVar1 != pdVar11);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 != maxiters);
  }
  if (pdVar14 != (double *)0x0) {
    free((void *)pdVar14[-1]);
  }
  if (local_1e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
      (double *)0x0) {
    free((void *)local_1e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data[-1]);
  }
  if (__s != (double *)0x0) {
    free((void *)__s[-1]);
  }
  return local_1d8;
}

Assistant:

double ChNonlinearSolver::NewtonRaphson(void (*m_func)(ChVectorRef mx, ChVectorRef res, void* my_data),
                                        void (*m_jacob)(ChVectorRef mx, ChMatrixRef mJ, void* my_data),
                                        ChVectorRef mx,
                                        void* my_data,
                                        int maxiters,
                                        double tolerance) {
    ChVectorDynamic<> res;
    ChVectorDynamic<> delta;
    ChMatrixDynamic<> jac;

    auto vars = mx.size();
    res.setZero(vars);
    jac.setZero(vars, vars);

    int iters = 0;
    double residual = 0;

    while (true) {
        if (iters >= maxiters)
            break;

        // compute residuals
        (*m_func)(mx, res, my_data);
        residual = res.lpNorm<Eigen::Infinity>();
        if (residual <= tolerance)
            break;

        // compute jacobian
        if (m_jacob)
            (*m_jacob)(mx, jac, my_data);
        else {
            ChNonlinearSolver::JacobianCompute(m_func, mx, res, my_data, jac, BDF_STEP_LOW);
        }

        // solve jac * delta = res
        delta = jac.colPivHouseholderQr().solve(res);
        mx -= delta;

        iters++;
    }
    return residual;
}